

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void ChooseDistanceParams(BrotliEncoderParams *params)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  
  if (3 < params->quality) {
    if (params->mode == BROTLI_MODE_FONT) {
      uVar2 = 1;
      uVar4 = 0xc;
    }
    else {
      uVar2 = (params->dist).distance_postfix_bits;
      uVar4 = (params->dist).num_direct_distance_codes;
    }
    if ((uVar4 < 0x79 && uVar2 < 4) &&
       (bVar3 = (byte)uVar2, (uVar4 >> (bVar3 & 0x1f) & 0xf) << (bVar3 & 0x1f) == uVar4)) {
      (params->dist).distance_postfix_bits = uVar2;
      (params->dist).num_direct_distance_codes = uVar4;
      if (params->large_window == 0) {
        uVar2 = (1 << (bVar3 + 0x1a & 0x1f)) + uVar4 + (-1 << (bVar3 + 2 & 0x1f));
        iVar5 = 0x18;
      }
      else {
        uVar1 = BrotliInitDistanceParams::bound[uVar2];
        if (uVar4 < uVar1) {
          uVar2 = (uVar4 - uVar1) + 0x7ffffffc;
          iVar5 = 0x3e;
        }
        else {
          iVar5 = 0x3e;
          uVar2 = 0x7ffffffc;
          if ((1 << (bVar3 & 0x1f)) + uVar1 <= uVar4) {
            uVar2 = (uVar4 - uVar1) + 0x5ffffffc;
          }
        }
      }
      (params->dist).alphabet_size = uVar4 + (iVar5 << (bVar3 + 1 & 0x1f)) + 0x10;
      (params->dist).max_distance = (ulong)uVar2;
      return;
    }
  }
  BrotliInitDistanceParams(params,0,0);
  return;
}

Assistant:

static void ChooseDistanceParams(BrotliEncoderParams* params) {
  uint32_t distance_postfix_bits = 0;
  uint32_t num_direct_distance_codes = 0;

  if (params->quality >= MIN_QUALITY_FOR_NONZERO_DISTANCE_PARAMS) {
    uint32_t ndirect_msb;
    if (params->mode == BROTLI_MODE_FONT) {
      distance_postfix_bits = 1;
      num_direct_distance_codes = 12;
    } else {
      distance_postfix_bits = params->dist.distance_postfix_bits;
      num_direct_distance_codes = params->dist.num_direct_distance_codes;
    }
    ndirect_msb = (num_direct_distance_codes >> distance_postfix_bits) & 0x0F;
    if (distance_postfix_bits > BROTLI_MAX_NPOSTFIX ||
        num_direct_distance_codes > BROTLI_MAX_NDIRECT ||
        (ndirect_msb << distance_postfix_bits) != num_direct_distance_codes) {
      distance_postfix_bits = 0;
      num_direct_distance_codes = 0;
    }
  }

  BrotliInitDistanceParams(
      params, distance_postfix_bits, num_direct_distance_codes);
}